

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O3

void __thiscall
Assimp::SMDImporter::AddBoneChildren(SMDImporter *this,aiNode *pcNode,uint32_t iParent)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  pointer pMVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  pointer pBVar34;
  aiNode **ppaVar35;
  aiNode *this_00;
  pointer pBVar36;
  uint uVar37;
  ulong uVar38;
  uint uVar39;
  ulong uVar40;
  ulong uVar41;
  
  if (pcNode == (aiNode *)0x0) {
    __assert_fail("nullptr != pcNode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/SMD/SMDLoader.cpp"
                  ,0x19a,"void Assimp::SMDImporter::AddBoneChildren(aiNode *, uint32_t)");
  }
  if (pcNode->mNumChildren == 0) {
    if (pcNode->mChildren == (aiNode **)0x0) {
      pBVar34 = (this->asBones).
                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
                super__Vector_impl_data._M_start;
      pBVar36 = (this->asBones).
                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
                super__Vector_impl_data._M_finish;
      uVar40 = 0;
      if (pBVar36 != pBVar34) {
        uVar37 = 1;
        uVar38 = 0;
        do {
          if (pBVar34[uVar38].iParent == iParent) {
            uVar39 = (int)uVar40 + 1;
            uVar40 = (ulong)uVar39;
            pcNode->mNumChildren = uVar39;
            pBVar34 = (this->asBones).
                      super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pBVar36 = (this->asBones).
                      super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          uVar38 = (ulong)uVar37;
          uVar41 = ((long)pBVar36 - (long)pBVar34 >> 4) * -0x71c71c71c71c71c7;
          uVar37 = uVar37 + 1;
        } while (uVar38 <= uVar41 && uVar41 - uVar38 != 0);
        uVar40 = uVar40 << 3;
      }
      ppaVar35 = (aiNode **)operator_new__(uVar40);
      pcNode->mChildren = ppaVar35;
      pBVar34 = (this->asBones).
                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
                super__Vector_impl_data._M_start;
      pBVar36 = (this->asBones).
                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (pBVar36 != pBVar34) {
        uVar40 = 0;
        uVar37 = 1;
        uVar39 = 0;
        do {
          if (pBVar34[uVar40].iParent == iParent) {
            this_00 = (aiNode *)operator_new(0x478);
            aiNode::aiNode(this_00);
            pBVar34 = pBVar34 + uVar40;
            pcNode->mChildren[uVar39] = this_00;
            uVar40 = (pBVar34->mName)._M_string_length;
            if (uVar40 < 0x400) {
              (this_00->mName).length = (ai_uint32)uVar40;
              memcpy((this_00->mName).data,(pBVar34->mName)._M_dataplus._M_p,uVar40);
              (this_00->mName).data[uVar40] = '\0';
            }
            pMVar17 = (pBVar34->sAnim).asKeys.
                      super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((pBVar34->sAnim).asKeys.
                super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                ._M_impl.super__Vector_impl_data._M_finish != pMVar17) {
              fVar12 = (pMVar17->matrix).a1;
              fVar13 = (pMVar17->matrix).a2;
              fVar14 = (pMVar17->matrix).a3;
              fVar15 = (pMVar17->matrix).a4;
              fVar8 = (pMVar17->matrix).b1;
              fVar9 = (pMVar17->matrix).b2;
              fVar10 = (pMVar17->matrix).b3;
              fVar11 = (pMVar17->matrix).b4;
              fVar4 = (pMVar17->matrix).c1;
              fVar5 = (pMVar17->matrix).c2;
              fVar6 = (pMVar17->matrix).c3;
              fVar7 = (pMVar17->matrix).c4;
              fVar1 = (pMVar17->matrix).d2;
              fVar2 = (pMVar17->matrix).d3;
              fVar3 = (pMVar17->matrix).d4;
              (this_00->mTransformation).d1 = (pMVar17->matrix).d1;
              (this_00->mTransformation).d2 = fVar1;
              (this_00->mTransformation).d3 = fVar2;
              (this_00->mTransformation).d4 = fVar3;
              (this_00->mTransformation).c1 = fVar4;
              (this_00->mTransformation).c2 = fVar5;
              (this_00->mTransformation).c3 = fVar6;
              (this_00->mTransformation).c4 = fVar7;
              (this_00->mTransformation).b1 = fVar8;
              (this_00->mTransformation).b2 = fVar9;
              (this_00->mTransformation).b3 = fVar10;
              (this_00->mTransformation).b4 = fVar11;
              (this_00->mTransformation).a1 = fVar12;
              (this_00->mTransformation).a2 = fVar13;
              (this_00->mTransformation).a3 = fVar14;
              (this_00->mTransformation).a4 = fVar15;
            }
            uVar40 = (ulong)pBVar34->iParent;
            if (uVar40 == 0xffffffff) {
              fVar12 = (this_00->mTransformation).a1;
              fVar13 = (this_00->mTransformation).a2;
              fVar14 = (this_00->mTransformation).a3;
              fVar15 = (this_00->mTransformation).a4;
              fVar8 = (this_00->mTransformation).b1;
              fVar9 = (this_00->mTransformation).b2;
              fVar10 = (this_00->mTransformation).b3;
              fVar11 = (this_00->mTransformation).b4;
              fVar4 = (this_00->mTransformation).c1;
              fVar5 = (this_00->mTransformation).c2;
              fVar6 = (this_00->mTransformation).c3;
              fVar7 = (this_00->mTransformation).c4;
              fVar1 = (this_00->mTransformation).d2;
              fVar2 = (this_00->mTransformation).d3;
              fVar3 = (this_00->mTransformation).d4;
              (pBVar34->mOffsetMatrix).d1 = (this_00->mTransformation).d1;
              (pBVar34->mOffsetMatrix).d2 = fVar1;
              (pBVar34->mOffsetMatrix).d3 = fVar2;
              (pBVar34->mOffsetMatrix).d4 = fVar3;
              (pBVar34->mOffsetMatrix).c1 = fVar4;
              (pBVar34->mOffsetMatrix).c2 = fVar5;
              (pBVar34->mOffsetMatrix).c3 = fVar6;
              (pBVar34->mOffsetMatrix).c4 = fVar7;
              (pBVar34->mOffsetMatrix).b1 = fVar8;
              (pBVar34->mOffsetMatrix).b2 = fVar9;
              (pBVar34->mOffsetMatrix).b3 = fVar10;
              (pBVar34->mOffsetMatrix).b4 = fVar11;
              (pBVar34->mOffsetMatrix).a1 = fVar12;
              (pBVar34->mOffsetMatrix).a2 = fVar13;
              (pBVar34->mOffsetMatrix).a3 = fVar14;
              (pBVar34->mOffsetMatrix).a4 = fVar15;
            }
            else {
              pBVar36 = (this->asBones).
                        super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              fVar1 = pBVar36[uVar40].mOffsetMatrix.a1;
              fVar2 = pBVar36[uVar40].mOffsetMatrix.a2;
              fVar3 = pBVar36[uVar40].mOffsetMatrix.a3;
              fVar4 = pBVar36[uVar40].mOffsetMatrix.a4;
              fVar18 = (this_00->mTransformation).a1;
              fVar19 = (this_00->mTransformation).a2;
              fVar20 = (this_00->mTransformation).a3;
              fVar21 = (this_00->mTransformation).a4;
              fVar22 = (this_00->mTransformation).b1;
              fVar23 = (this_00->mTransformation).b2;
              fVar24 = (this_00->mTransformation).b3;
              fVar25 = (this_00->mTransformation).b4;
              fVar26 = (this_00->mTransformation).c1;
              fVar27 = (this_00->mTransformation).c2;
              fVar28 = (this_00->mTransformation).c3;
              fVar29 = (this_00->mTransformation).c4;
              fVar30 = (this_00->mTransformation).d1;
              fVar31 = (this_00->mTransformation).d2;
              fVar32 = (this_00->mTransformation).d3;
              fVar33 = (this_00->mTransformation).d4;
              fVar5 = pBVar36[uVar40].mOffsetMatrix.b2;
              fVar6 = pBVar36[uVar40].mOffsetMatrix.b1;
              fVar7 = pBVar36[uVar40].mOffsetMatrix.b3;
              fVar8 = pBVar36[uVar40].mOffsetMatrix.b4;
              fVar9 = pBVar36[uVar40].mOffsetMatrix.c2;
              fVar10 = pBVar36[uVar40].mOffsetMatrix.c1;
              fVar11 = pBVar36[uVar40].mOffsetMatrix.c3;
              fVar12 = pBVar36[uVar40].mOffsetMatrix.c4;
              fVar13 = pBVar36[uVar40].mOffsetMatrix.d2;
              fVar14 = pBVar36[uVar40].mOffsetMatrix.d1;
              fVar15 = pBVar36[uVar40].mOffsetMatrix.d3;
              fVar16 = pBVar36[uVar40].mOffsetMatrix.d4;
              (pBVar34->mOffsetMatrix).a1 =
                   fVar4 * fVar30 + fVar3 * fVar26 + fVar1 * fVar18 + fVar2 * fVar22;
              (pBVar34->mOffsetMatrix).a2 =
                   fVar4 * fVar31 + fVar3 * fVar27 + fVar1 * fVar19 + fVar2 * fVar23;
              (pBVar34->mOffsetMatrix).a3 =
                   fVar4 * fVar32 + fVar3 * fVar28 + fVar1 * fVar20 + fVar2 * fVar24;
              (pBVar34->mOffsetMatrix).a4 =
                   fVar4 * fVar33 + fVar3 * fVar29 + fVar1 * fVar21 + fVar2 * fVar25;
              (pBVar34->mOffsetMatrix).b1 =
                   fVar8 * fVar30 + fVar7 * fVar26 + fVar6 * fVar18 + fVar5 * fVar22;
              (pBVar34->mOffsetMatrix).b2 =
                   fVar8 * fVar31 + fVar7 * fVar27 + fVar6 * fVar19 + fVar5 * fVar23;
              (pBVar34->mOffsetMatrix).b3 =
                   fVar8 * fVar32 + fVar7 * fVar28 + fVar6 * fVar20 + fVar5 * fVar24;
              (pBVar34->mOffsetMatrix).b4 =
                   fVar8 * fVar33 + fVar7 * fVar29 + fVar6 * fVar21 + fVar5 * fVar25;
              (pBVar34->mOffsetMatrix).c1 =
                   fVar12 * fVar30 + fVar11 * fVar26 + fVar10 * fVar18 + fVar9 * fVar22;
              (pBVar34->mOffsetMatrix).c2 =
                   fVar12 * fVar31 + fVar11 * fVar27 + fVar10 * fVar19 + fVar9 * fVar23;
              (pBVar34->mOffsetMatrix).c3 =
                   fVar12 * fVar32 + fVar11 * fVar28 + fVar10 * fVar20 + fVar9 * fVar24;
              (pBVar34->mOffsetMatrix).c4 =
                   fVar12 * fVar33 + fVar11 * fVar29 + fVar10 * fVar21 + fVar9 * fVar25;
              (pBVar34->mOffsetMatrix).d1 =
                   fVar16 * fVar30 + fVar15 * fVar26 + fVar14 * fVar18 + fVar13 * fVar22;
              (pBVar34->mOffsetMatrix).d2 =
                   fVar16 * fVar31 + fVar15 * fVar27 + fVar14 * fVar19 + fVar13 * fVar23;
              (pBVar34->mOffsetMatrix).d3 =
                   fVar16 * fVar32 + fVar15 * fVar28 + fVar14 * fVar20 + fVar13 * fVar24;
              (pBVar34->mOffsetMatrix).d4 =
                   fVar16 * fVar33 + fVar15 * fVar29 + fVar14 * fVar21 + fVar13 * fVar25;
            }
            uVar39 = uVar39 + 1;
            this_00->mParent = pcNode;
            AddBoneChildren(this,this_00,uVar37 - 1);
            pBVar34 = (this->asBones).
                      super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pBVar36 = (this->asBones).
                      super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          uVar40 = (ulong)uVar37;
          uVar38 = ((long)pBVar36 - (long)pBVar34 >> 4) * -0x71c71c71c71c71c7;
          uVar37 = uVar37 + 1;
        } while (uVar40 <= uVar38 && uVar38 - uVar40 != 0);
      }
      return;
    }
    __assert_fail("nullptr == pcNode->mChildren",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/SMD/SMDLoader.cpp"
                  ,0x19c,"void Assimp::SMDImporter::AddBoneChildren(aiNode *, uint32_t)");
  }
  __assert_fail("0 == pcNode->mNumChildren",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/SMD/SMDLoader.cpp"
                ,0x19b,"void Assimp::SMDImporter::AddBoneChildren(aiNode *, uint32_t)");
}

Assistant:

void SMDImporter::AddBoneChildren(aiNode* pcNode, uint32_t iParent) {
    ai_assert( nullptr != pcNode );
    ai_assert( 0 == pcNode->mNumChildren );
    ai_assert( nullptr == pcNode->mChildren);

    // first count ...
    for (unsigned int i = 0; i < asBones.size();++i) {
        SMD::Bone& bone = asBones[i];
        if (bone.iParent == iParent) {
            ++pcNode->mNumChildren;
        }
    }

    // now allocate the output array
    pcNode->mChildren = new aiNode*[pcNode->mNumChildren];

    // and fill all subnodes
    unsigned int qq( 0 );
    for (unsigned int i = 0; i < asBones.size();++i) {
        SMD::Bone& bone = asBones[i];
        if (bone.iParent != iParent) {
            continue;
        }

        aiNode* pc = pcNode->mChildren[qq++] = new aiNode();
        pc->mName.Set(bone.mName);

        // store the local transformation matrix of the bind pose
        if (bone.sAnim.asKeys.size()) {
            pc->mTransformation = bone.sAnim.asKeys[0].matrix;
        }

        if (bone.iParent == static_cast<uint32_t>(-1)) { 
            bone.mOffsetMatrix = pc->mTransformation;
        } else {
            bone.mOffsetMatrix = asBones[bone.iParent].mOffsetMatrix * pc->mTransformation;
        }

        pc->mParent = pcNode;

        // add children to this node, too
        AddBoneChildren(pc,i);
    }
}